

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::DeInitializeJointActionObservationHistories
          (PlanningUnitMADPDiscrete *this)

{
  pointer ppJVar1;
  pointer ppJVar2;
  pointer pdVar3;
  pointer puVar4;
  pointer puVar5;
  mapped_type *ppJVar6;
  pointer ppJVar7;
  key_type local_20;
  
  if (this->_m_jointActionObservationHistoryTreeRoot != (JointActionObservationHistoryTree *)0x0) {
    (*(this->_m_jointActionObservationHistoryTreeRoot->super_TreeNode<JointActionObservationHistory>
      )._vptr_TreeNode[1])();
  }
  ppJVar1 = (this->_m_jointActionObservationHistoryTreeVector).
            super__Vector_base<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_jointActionObservationHistoryTreeVector).
      super__Vector_base<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppJVar1) {
    (this->_m_jointActionObservationHistoryTreeVector).
    super__Vector_base<JointActionObservationHistoryTree_*,_std::allocator<JointActionObservationHistoryTree_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppJVar1;
  }
  if ((this->_m_jointActionObservationHistoryTreeMap)._M_t._M_impl.super__Rb_tree_header.
      _M_node_count != 0) {
    local_20 = 0;
    ppJVar6 = std::
              map<unsigned_long_long,_JointActionObservationHistoryTree_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
              ::operator[](&this->_m_jointActionObservationHistoryTreeMap,&local_20);
    if (*ppJVar6 != (mapped_type)0x0) {
      (*((*ppJVar6)->super_TreeNode<JointActionObservationHistory>)._vptr_TreeNode[1])();
    }
  }
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>,_std::_Select1st<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_JointActionObservationHistoryTree_*>_>_>
  ::clear(&(this->_m_jointActionObservationHistoryTreeMap)._M_t);
  if ((this->_m_params)._m_JointBeliefs == true) {
    ppJVar2 = (this->_m_jBeliefCache).
              super__Vector_base<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppJVar7 = (this->_m_jBeliefCache).
                   super__Vector_base<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppJVar7 != ppJVar2;
        ppJVar7 = ppJVar7 + 1) {
      if (*ppJVar7 != (JointBeliefInterface *)0x0) {
        (**(code **)((long)**ppJVar7 + 8))();
      }
    }
    ppJVar7 = (this->_m_jBeliefCache).
              super__Vector_base<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->_m_jBeliefCache).
        super__Vector_base<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppJVar7) {
      (this->_m_jBeliefCache).
      super__Vector_base<const_JointBeliefInterface_*,_std::allocator<const_JointBeliefInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppJVar7;
    }
    pdVar3 = (this->_m_jaohConditionalProbs).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_m_jaohConditionalProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar3) {
      (this->_m_jaohConditionalProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar3;
    }
  }
  this->_m_nrJointActionObservationHistories = 0;
  puVar4 = (this->_m_nrJointActionObservationHistoriesT).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_m_nrJointActionObservationHistoriesT).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->_m_nrJointActionObservationHistoriesT).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  puVar5 = (this->_m_firstJAOHIforT).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_m_firstJAOHIforT).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->_m_firstJAOHIforT).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  return;
}

Assistant:

void PlanningUnitMADPDiscrete::DeInitializeJointActionObservationHistories()
{
    delete _m_jointActionObservationHistoryTreeRoot;//should recursively delete

    _m_jointActionObservationHistoryTreeVector.clear();

    // clear the map
    if(!_m_jointActionObservationHistoryTreeMap.empty())
        delete _m_jointActionObservationHistoryTreeMap[0];
    _m_jointActionObservationHistoryTreeMap.clear();
       
    if(_m_params.GetComputeJointBeliefs())
    {
        vector<const JointBeliefInterface*>::iterator it =
            _m_jBeliefCache.begin();
        vector<const JointBeliefInterface*>::iterator last =
            _m_jBeliefCache.end();
        
        while(it != last)
        {
            delete(*it);
            it++;
        }
        _m_jBeliefCache.clear();
        _m_jaohConditionalProbs.clear();
    }

    _m_nrJointActionObservationHistories=0;
    _m_nrJointActionObservationHistoriesT.clear();
    _m_firstJAOHIforT.clear();
}